

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780Analyzer.cpp
# Opt level: O0

bool __thiscall
HD44780Analyzer::GetOperation
          (HD44780Analyzer *this,bool *ARS,bool *ARW,U8 *AData,S64 *AEStart,S64 *AEEnd,
          bool ASecondNibble)

{
  long lVar1;
  AnalyzerChannelData *pAVar2;
  U32 UVar3;
  int iVar4;
  S64 SVar5;
  element_type *peVar6;
  element_type *peVar7;
  long lVar8;
  U64 UVar9;
  ulong uVar10;
  ulong uVar11;
  Channel local_c0 [16];
  Channel local_b0 [16];
  Channel local_a0 [16];
  Channel local_90 [16];
  Channel local_80 [32];
  Channel local_60 [16];
  U32 local_50;
  uint local_4c;
  U32 ui1;
  U32 dbline;
  U64 pos;
  U64 *pUStack_38;
  bool ASecondNibble_local;
  S64 *AEEnd_local;
  S64 *AEStart_local;
  U8 *AData_local;
  bool *ARW_local;
  bool *ARS_local;
  HD44780Analyzer *this_local;
  
  pos._7_1_ = ASecondNibble;
  pUStack_38 = (U64 *)AEEnd;
  AEEnd_local = AEStart;
  AEStart_local = (S64 *)AData;
  AData_local = ARW;
  ARW_local = ARS;
  ARS_local = (bool *)this;
  AnalyzerChannelData::AdvanceToNextEdge();
  SVar5 = AnalyzerChannelData::GetSampleNumber();
  *AEEnd_local = SVar5;
  peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
  if (((peVar6->mMarkTimingErrors & 1U) != 0) && (this->mLastEStart != 0)) {
    lVar1 = *AEEnd_local;
    UVar9 = this->mLastEStart;
    peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    UVar3 = TimeToSamplesOrMore(this,(double)peVar6->mEnableCycleMin / 1000000000.0);
    if (lVar1 - UVar9 < (ulong)UVar3) {
      peVar7 = std::auto_ptr<HD44780AnalyzerResults>::operator->(&this->mResults);
      SVar5 = *AEEnd_local;
      std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)peVar7,(MarkerType)SVar5,(Channel *)0x6);
    }
  }
  this->mLastEStart = *AEEnd_local;
  if ((pos._7_1_ & 1) == 0) {
    peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    local_50 = TimeToSamplesOrMore(this,(double)peVar6->mAddressSetupMin / 1000000000.0);
    if ((long)(ulong)local_50 < *AEEnd_local) {
      lVar1 = *AEEnd_local;
      uVar11 = (ulong)local_50;
      lVar8 = AnalyzerChannelData::GetSampleNumber();
      if (lVar8 < (long)(lVar1 - uVar11)) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mRS);
      }
      if ((this->mRW != (AnalyzerChannelData *)0x0) &&
         (lVar1 = *AEEnd_local, uVar11 = (ulong)local_50,
         lVar8 = AnalyzerChannelData::GetSampleNumber(), lVar8 < (long)(lVar1 - uVar11))) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mRW);
      }
    }
  }
  pAVar2 = this->mRS;
  peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
  Channel::Channel(local_60,&peVar6->mRSChannel);
  AdvanceToAbsPositionWhileMarking(this,pAVar2,local_60,*AEEnd_local);
  Channel::~Channel(local_60);
  if (this->mRW != (AnalyzerChannelData *)0x0) {
    pAVar2 = this->mRW;
    peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    Channel::Channel(local_80,&peVar6->mRWChannel);
    AdvanceToAbsPositionWhileMarking(this,pAVar2,local_80,*AEEnd_local);
    Channel::~Channel(local_80);
  }
  iVar4 = AnalyzerChannelData::GetBitState();
  *ARW_local = (bool)(-(iVar4 == 1) & 1);
  if ((pos._7_1_ & 1) == 0) {
    peVar7 = std::auto_ptr<HD44780AnalyzerResults>::operator->(&this->mResults);
    SVar5 = *AEEnd_local;
    std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)peVar7,(MarkerType)SVar5,(Channel *)0x0);
  }
  if (this->mRW == (AnalyzerChannelData *)0x0) {
    *AData_local = '\0';
  }
  else {
    iVar4 = AnalyzerChannelData::GetBitState();
    *AData_local = -(iVar4 == 1) & 1;
    if ((pos._7_1_ & 1) == 0) {
      peVar7 = std::auto_ptr<HD44780AnalyzerResults>::operator->(&this->mResults);
      SVar5 = *AEEnd_local;
      std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)peVar7,(MarkerType)SVar5,(Channel *)0x0);
    }
  }
  AnalyzerChannelData::AdvanceToNextEdge();
  UVar9 = AnalyzerChannelData::GetSampleNumber();
  *pUStack_38 = UVar9;
  peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
  if ((peVar6->mMarkTimingErrors & 1U) != 0) {
    UVar9 = *pUStack_38;
    lVar1 = *AEEnd_local;
    peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    UVar3 = TimeToSamplesOrMore(this,(double)peVar6->mEnablePulseWidthMin / 1000000000.0);
    if ((long)(UVar9 - lVar1) < (long)(ulong)UVar3) {
      peVar7 = std::auto_ptr<HD44780AnalyzerResults>::operator->(&this->mResults);
      UVar9 = *pUStack_38;
      std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)peVar7,(MarkerType)UVar9,(Channel *)0x6);
    }
  }
  if ((*AData_local & 1) == 0) {
    UVar9 = *pUStack_38;
    peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    UVar3 = TimeToSamplesOrMore(this,(double)peVar6->mDataWriteSetupMin / 1000000000.0);
    _ui1 = UVar9 - UVar3;
  }
  else {
    lVar1 = *AEEnd_local;
    peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    UVar3 = TimeToSamplesOrMore(this,(double)peVar6->mDataReadDelayMax / 1000000000.0);
    _ui1 = lVar1 + (ulong)UVar3;
  }
  for (local_4c = 0; uVar11 = _ui1, local_4c < 8; local_4c = local_4c + 1) {
    if (this->mDB[local_4c] != (AnalyzerChannelData *)0x0) {
      uVar10 = AnalyzerChannelData::GetSampleNumber();
      if (uVar10 < uVar11) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mDB[local_4c]);
      }
      pAVar2 = this->mDB[local_4c];
      peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
      Channel::Channel(local_90,(Channel *)(&peVar6->field_0x40 + (ulong)local_4c * 0x10));
      AdvanceToAbsPositionWhileMarking(this,pAVar2,local_90,*pUStack_38);
      Channel::~Channel(local_90);
    }
  }
  *(undefined1 *)AEStart_local = 0;
  for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
    if (this->mDB[local_4c] != (AnalyzerChannelData *)0x0) {
      iVar4 = AnalyzerChannelData::GetBitState();
      if (iVar4 == 1) {
        *(byte *)AEStart_local = (byte)*AEStart_local | (byte)(1 << ((byte)local_4c & 0x1f));
      }
      peVar7 = std::auto_ptr<HD44780AnalyzerResults>::operator->(&this->mResults);
      UVar9 = *pUStack_38;
      std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)peVar7,(MarkerType)UVar9,(Channel *)0x0);
    }
  }
  pAVar2 = this->mRS;
  peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
  Channel::Channel(local_a0,&peVar6->mRSChannel);
  UVar9 = *pUStack_38;
  peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
  UVar3 = TimeToSamplesOrMore(this,(double)peVar6->mAddressHoldMin / 1000000000.0);
  AdvanceToAbsPositionWhileMarking(this,pAVar2,local_a0,UVar9 + UVar3);
  Channel::~Channel(local_a0);
  if (this->mRW != (AnalyzerChannelData *)0x0) {
    pAVar2 = this->mRW;
    peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    Channel::Channel(local_b0,&peVar6->mRWChannel);
    UVar9 = *pUStack_38;
    peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    UVar3 = TimeToSamplesOrMore(this,(double)peVar6->mAddressHoldMin / 1000000000.0);
    AdvanceToAbsPositionWhileMarking(this,pAVar2,local_b0,UVar9 + UVar3);
    Channel::~Channel(local_b0);
  }
  if ((*AData_local & 1) == 0) {
    UVar9 = *pUStack_38;
    peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    UVar3 = TimeToSamplesOrMore(this,(double)peVar6->mDataWriteHoldMin / 1000000000.0);
    _ui1 = UVar9 + UVar3;
  }
  else {
    UVar9 = *pUStack_38;
    peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
    UVar3 = TimeToSamplesOrMore(this,(double)peVar6->mDataReadHoldMin / 1000000000.0);
    _ui1 = UVar9 + UVar3;
  }
  for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
    if (this->mDB[local_4c] != (AnalyzerChannelData *)0x0) {
      pAVar2 = this->mDB[local_4c];
      peVar6 = std::auto_ptr<HD44780AnalyzerSettings>::operator->(&this->mSettings);
      Channel::Channel(local_c0,(Channel *)(&peVar6->field_0x40 + (ulong)local_4c * 0x10));
      AdvanceToAbsPositionWhileMarking(this,pAVar2,local_c0,_ui1);
      Channel::~Channel(local_c0);
    }
  }
  return true;
}

Assistant:

bool HD44780Analyzer::GetOperation( bool& ARS, bool& ARW, U8& AData, S64& AEStart, S64& AEEnd, bool ASecondNibble )
{
    U64 pos;
    U32 dbline, ui1;

    // move to the E high transition
    mE->AdvanceToNextEdge();
    AEStart = mE->GetSampleNumber();

    // check between E high transitions for >= mEnableCycleMin
    if( mSettings->mMarkTimingErrors && mLastEStart && AEStart - mLastEStart < TimeToSamplesOrMore( mSettings->mEnableCycleMin / _NS ) )
        mResults->AddMarker( AEStart, AnalyzerResults::X, mSettings->mEChannel );
    mLastEStart = AEStart;

    // advance rs/rw to the e position less mAddressSetupMin if in 8 bit mode or if in the first nibble of 4 bit mode
    if( !ASecondNibble )
    {
        ui1 = TimeToSamplesOrMore( mSettings->mAddressSetupMin / _NS );
        if( AEStart > ui1 )
        {
            if( AEStart - ui1 > ( S64 )mRS->GetSampleNumber() )
                mRS->AdvanceToAbsPosition( AEStart - ui1 );
            if( mRW != NULL && AEStart - ui1 > ( S64 )mRW->GetSampleNumber() ) // mRW is optional
                mRW->AdvanceToAbsPosition( AEStart - ui1 );
        }
    }

    // advance rs/rw to the estart position while marking any changes
    AdvanceToAbsPositionWhileMarking( mRS, mSettings->mRSChannel, AEStart );
    if( mRW != NULL ) // mRW is optional
        AdvanceToAbsPositionWhileMarking( mRW, mSettings->mRWChannel, AEStart );

    // sample rs/rw
    ARS = ( mRS->GetBitState() == BIT_HIGH ) ? true : false;
    if( !ASecondNibble ) // do not mark second nibble rs/rw
        mResults->AddMarker( AEStart, AnalyzerResults::Dot, mSettings->mRSChannel );
    if( mRW != NULL ) // mRW is optional
    {
        ARW = ( mRW->GetBitState() == BIT_HIGH ) ? true : false;
        if( !ASecondNibble ) // do not mark second nibble rs/rw
            mResults->AddMarker( AEStart, AnalyzerResults::Dot, mSettings->mRWChannel );
    }
    else
        ARW = false; // if RW not present we assume it is ground (write)

    // move to the E low transition
    mE->AdvanceToNextEdge();
    AEEnd = mE->GetSampleNumber();

    // check E pulse width for >= mEnablePulseWidthMin
    if( mSettings->mMarkTimingErrors && AEEnd - AEStart < TimeToSamplesOrMore( mSettings->mEnablePulseWidthMin / _NS ) )
        mResults->AddMarker( AEEnd, AnalyzerResults::X, mSettings->mEChannel );

    // determine position to advance dbX and advance dbX based on read/write
    // advance dbX to the eend position while marking any changes
    if( ARW )
        pos = AEStart + TimeToSamplesOrMore( mSettings->mDataReadDelayMax / _NS );
    else
        pos = AEEnd - TimeToSamplesOrMore( mSettings->mDataWriteSetupMin / _NS );
    for( dbline = 0; dbline < 8; dbline++ )
        if( mDB[ dbline ] != NULL ) // some channels are optional
        {
            if( pos > mDB[ dbline ]->GetSampleNumber() )
                mDB[ dbline ]->AdvanceToAbsPosition( pos );
            AdvanceToAbsPositionWhileMarking( mDB[ dbline ], mSettings->mDBChannel[ dbline ], AEEnd );
        }

    // sample dbX
    AData = 0;
    for( dbline = 0; dbline < 8; dbline++ )
        if( mDB[ dbline ] != NULL ) // some channels are optional
        {
            if( mDB[ dbline ]->GetBitState() == BIT_HIGH )
                AData |= ( 1 << dbline );
            mResults->AddMarker( AEEnd, AnalyzerResults::Dot, mSettings->mDBChannel[ dbline ] );
        }

    // advance rs/rw to the eend+mAddressHoldMin while marking any changes
    AdvanceToAbsPositionWhileMarking( mRS, mSettings->mRSChannel, AEEnd + TimeToSamplesOrMore( mSettings->mAddressHoldMin / _NS ) );
    if( mRW != NULL ) // mRW is optional
        AdvanceToAbsPositionWhileMarking( mRW, mSettings->mRWChannel, AEEnd + TimeToSamplesOrMore( mSettings->mAddressHoldMin / _NS ) );

    // advance dbX to the eend+mDataReadHoldMin (read) or eend+mDataWriteHoldMin (write)
    if( ARW )
        pos = AEEnd + TimeToSamplesOrMore( mSettings->mDataReadHoldMin / _NS );
    else
        pos = AEEnd + TimeToSamplesOrMore( mSettings->mDataWriteHoldMin / _NS );
    for( dbline = 0; dbline < 8; dbline++ )
        if( mDB[ dbline ] != NULL ) // some channels are optional
            AdvanceToAbsPositionWhileMarking( mDB[ dbline ], mSettings->mDBChannel[ dbline ], pos );

    return true;
}